

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O0

void free_ftmgr(ftmgr **ftmgr)

{
  ftmgr *__ptr;
  int local_1c;
  int i;
  ftmgr *ft;
  ftmgr **ftmgr_local;
  
  __ptr = *ftmgr;
  *ftmgr = (ftmgr *)0x0;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    free(__ptr->ftq[local_1c].blk);
  }
  if (__ptr->fd != -1) {
    close(__ptr->fd);
  }
  free(__ptr);
  return;
}

Assistant:

void free_ftmgr(struct ftmgr **ftmgr)
{
    struct ftmgr *ft = *ftmgr;
    *ftmgr = NULL;
    for(int i = 0;i < FTQ_NR;i++) {
        free(ft->ftq[i].blk);
    }
    if(ft->fd != -1)
        close(ft->fd);
    free(ft);
}